

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O0

void Ivy_ManTestCutsTravAll(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *vFront_00;
  Vec_Int_t *vStore_00;
  Vec_Vec_t *vBitCuts_00;
  Ivy_Obj_t *pObj_00;
  Ivy_Store_t *pIVar4;
  abctime aVar5;
  abctime clk;
  uint local_50;
  int nNodeOver;
  int nNodeTotal;
  int nCutsTotal;
  int nCutsCut;
  int i;
  Vec_Vec_t *vBitCuts;
  Vec_Int_t *vStore;
  Vec_Ptr_t *vFront;
  Vec_Ptr_t *vNodes;
  Ivy_Obj_t *pObj;
  Ivy_Store_t *pStore;
  Ivy_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  vNodes_00 = Vec_PtrAlloc(100);
  vFront_00 = Vec_PtrAlloc(100);
  vStore_00 = Vec_IntAlloc(100);
  vBitCuts_00 = Vec_VecAlloc(100);
  clk._4_4_ = 0;
  local_50 = 0;
  iVar1 = Ivy_ManNodeNum(p);
  nNodeOver = -iVar1;
  for (nCutsTotal = 0; iVar1 = Vec_PtrSize(p->vObjs), nCutsTotal < iVar1;
      nCutsTotal = nCutsTotal + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nCutsTotal);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pObj_00), iVar1 != 0)) {
      pIVar4 = Ivy_NodeFindCutsTravAll(p,pObj_00,4,0x3c,vNodes_00,vFront_00,vStore_00,vBitCuts_00);
      nNodeOver = pIVar4->nCuts + nNodeOver;
      clk._4_4_ = (pIVar4->nCuts == 0x100) + clk._4_4_;
      local_50 = local_50 + 1;
    }
  }
  iVar1 = Ivy_ManPiNum(p);
  iVar2 = Ivy_ManNodeNum(p);
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)(uint)nNodeOver,
         (ulong)(uint)(iVar1 + iVar2),(ulong)local_50,(ulong)clk._4_4_);
  Abc_Print(1,"%s =","Time");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(vFront_00);
  Vec_IntFree(vStore_00);
  Vec_VecFree(vBitCuts_00);
  return;
}

Assistant:

void Ivy_ManTestCutsTravAll( Ivy_Man_t * p )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    Vec_Ptr_t * vNodes, * vFront;
    Vec_Int_t * vStore;
    Vec_Vec_t * vBitCuts;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();

    vNodes = Vec_PtrAlloc( 100 );
    vFront = Vec_PtrAlloc( 100 );
    vStore = Vec_IntAlloc( 100 );
    vBitCuts = Vec_VecAlloc( 100 );

    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_NodeFindCutsTravAll( p, pObj, 4, 60, vNodes, vFront, vStore, vBitCuts );
        nCutsCut    = pStore->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );

    Vec_PtrFree( vNodes );
    Vec_PtrFree( vFront );
    Vec_IntFree( vStore );
    Vec_VecFree( vBitCuts );

}